

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.h
# Opt level: O2

QString * __thiscall
QMakeEvaluator::resolvePath(QString *__return_storage_ptr__,QMakeEvaluator *this,QString *fileName)

{
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  currentDirectory((QString *)&QStack_38,this);
  QMakeInternal::IoUtils::resolvePath(__return_storage_ptr__,(QString *)&QStack_38,fileName);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString resolvePath(const QString &fileName) const
        { return QMakeInternal::IoUtils::resolvePath(currentDirectory(), fileName); }